

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O2

bool operator==(CExtPubKey *a,CExtPubKey *b)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((a->nDepth == b->nDepth) && (*(int *)a->vchFingerprint == *(int *)b->vchFingerprint)) &&
     (a->nChild == b->nChild)) {
    bVar2 = operator==(&(a->chaincode).super_base_blob<256U>,&(b->chaincode).super_base_blob<256U>);
    if (bVar2) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        bVar2 = operator==(&a->pubkey,&b->pubkey);
        return bVar2;
      }
      goto LAB_0032f389;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return false;
  }
LAB_0032f389:
  __stack_chk_fail();
}

Assistant:

bool operator==(const CExtPubKey &a, const CExtPubKey &b)
    {
        return a.nDepth == b.nDepth &&
            memcmp(a.vchFingerprint, b.vchFingerprint, sizeof(vchFingerprint)) == 0 &&
            a.nChild == b.nChild &&
            a.chaincode == b.chaincode &&
            a.pubkey == b.pubkey;
    }